

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

QTextHtmlParserNode * __thiscall QTextHtmlParser::newNode(QTextHtmlParser *this,int parent)

{
  long lVar1;
  bool bVar2;
  QTextHtmlParserNode **ppQVar3;
  qsizetype qVar4;
  QTextHtmlParserNode *pQVar5;
  int in_ESI;
  QList<QTextHtmlParserNode_*> *in_RDI;
  long in_FS_OFFSET;
  int lastSibling;
  bool reuseLastNode;
  QTextHtmlParserNode *newNode;
  QTextHtmlParserNode *lastNode;
  parameter_type in_stack_ffffffffffffffa8;
  int i;
  QTextHtmlParser *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  int local_38;
  QTextHtmlParserNode *this_00;
  QTextHtmlParserNode *pQVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar3 = QList<QTextHtmlParserNode_*>::last
                      ((QList<QTextHtmlParserNode_*> *)in_stack_ffffffffffffffa8);
  pQVar6 = *ppQVar3;
  this_00 = (QTextHtmlParserNode *)0x0;
  qVar4 = QList<QTextHtmlParserNode_*>::size(in_RDI);
  if (qVar4 == 1) {
    bVar2 = false;
  }
  else {
    bVar2 = QString::isEmpty((QString *)0x859be8);
    if (bVar2) {
      bVar2 = QString::isEmpty((QString *)0x859bff);
      if (bVar2) {
        bVar2 = true;
      }
      else {
        qVar4 = QString::size(&pQVar6->text);
        bVar2 = false;
        if (qVar4 == 1) {
          QString::at((QString *)
                      (ulong)CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8),
                      (qsizetype)in_stack_ffffffffffffffb0);
          bVar2 = QChar::isSpace((QChar *)0x859c4d);
        }
        if (bVar2 == false) {
          bVar2 = false;
        }
        else {
          local_38 = count((QTextHtmlParser *)0x859c68);
          local_38 = local_38 + -2;
          while( true ) {
            bVar2 = false;
            if (local_38 != 0) {
              pQVar5 = at(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20))
              ;
              bVar2 = false;
              if (pQVar5->parent != pQVar6->parent) {
                pQVar5 = at(in_stack_ffffffffffffffb0,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                bVar2 = (*(ushort *)&pQVar5->field_0x90 >> 9 & 7) == 1;
              }
            }
            i = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
            if (!bVar2) break;
            pQVar5 = at(in_stack_ffffffffffffffb0,i);
            local_38 = pQVar5->parent;
          }
          pQVar5 = at(in_stack_ffffffffffffffb0,i);
          bVar2 = (*(ushort *)&pQVar5->field_0x90 >> 9 & 7) != 1;
        }
      }
    }
    else {
      bVar2 = false;
    }
  }
  if (bVar2) {
    QString::clear((QString *)in_stack_ffffffffffffffb0);
    QString::clear((QString *)in_stack_ffffffffffffffb0);
    pQVar6->id = Html_unknown;
  }
  else {
    operator_new(0x1e0);
    QTextHtmlParserNode::QTextHtmlParserNode(this_00);
    QList<QTextHtmlParserNode_*>::append
              ((QList<QTextHtmlParserNode_*> *)0x859d88,in_stack_ffffffffffffffa8);
    ppQVar3 = QList<QTextHtmlParserNode_*>::last
                        ((QList<QTextHtmlParserNode_*> *)in_stack_ffffffffffffffa8);
    pQVar6 = *ppQVar3;
  }
  pQVar6->parent = in_ESI;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar6;
}

Assistant:

QTextHtmlParserNode *QTextHtmlParser::newNode(int parent)
{
    QTextHtmlParserNode *lastNode = nodes.last();
    QTextHtmlParserNode *newNode = nullptr;

    bool reuseLastNode = true;

    if (nodes.size() == 1) {
        reuseLastNode = false;
    } else if (lastNode->tag.isEmpty()) {

        if (lastNode->text.isEmpty()) {
            reuseLastNode = true;
        } else { // last node is a text node (empty tag) with some text

            if (lastNode->text.size() == 1 && lastNode->text.at(0).isSpace()) {

                int lastSibling = count() - 2;
                while (lastSibling
                       && at(lastSibling).parent != lastNode->parent
                       && at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    lastSibling = at(lastSibling).parent;
                }

                if (at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    reuseLastNode = false;
                } else {
                    reuseLastNode = true;
                }
            } else {
                // text node with real (non-whitespace) text -> nothing to re-use
                reuseLastNode = false;
            }

        }

    } else {
        // last node had a proper tag -> nothing to re-use
        reuseLastNode = false;
    }

    if (reuseLastNode) {
        newNode = lastNode;
        newNode->tag.clear();
        newNode->text.clear();
        newNode->id = Html_unknown;
    } else {
        nodes.append(new QTextHtmlParserNode);
        newNode = nodes.last();
    }

    newNode->parent = parent;
    return newNode;
}